

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
DistanceGraph::find_bubbles
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,DistanceGraph *this,uint32_t min_size,uint32_t max_size)

{
  ulong uVar1;
  long lVar2;
  pointer pLVar3;
  size_type sVar4;
  reference rVar5;
  ulong local_d0;
  vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *local_c8;
  size_type local_c0;
  vector<Link,_std::allocator<Link>_> fwl;
  vector<Link,_std::allocator<Link>_> parln;
  vector<Link,_std::allocator<Link>_> bwl;
  vector<Link,_std::allocator<Link>_> parlp;
  vector<bool,_std::allocator<bool>_> used;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data._M_start._0_1_
       = 0;
  local_c8 = (vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
             __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&used,((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x38,(bool *)&fwl,
             (allocator_type *)&bwl);
  local_d0 = 1;
  while( true ) {
    if ((ulong)(((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x38) <= local_d0) break;
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,local_d0);
    if (((*rVar5._M_p & rVar5._M_mask) == 0) &&
       (uVar1 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start[local_d0].sequence._M_string_length,
       uVar1 <= max_size && min_size <= uVar1)) {
      get_fw_links(&fwl,this,local_d0);
      if ((long)fwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          CONCAT71(fwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                   super__Vector_impl_data._M_start._1_7_,
                   fwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                   super__Vector_impl_data._M_start._0_1_) == 0x28) {
        get_bw_links(&bwl,this,local_d0);
        if ((long)bwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)bwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x28) {
          lVar2 = (bwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                   super__Vector_impl_data._M_start)->dest;
          get_bw_links(&parln,this,
                       *(sgNodeID_t *)
                        (CONCAT71(fwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start._1_7_,
                                  fwl.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_1_) + 8));
          if ((long)parln.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)parln.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x50) {
            get_fw_links(&parlp,this,-lVar2);
            if ((long)parlp.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)parlp.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x50) {
              pLVar3 = parlp.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
              if ((parlp.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                   super__Vector_impl_data._M_start)->dest != local_d0) {
                pLVar3 = parlp.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              local_c0 = pLVar3->dest;
              if (((parln.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start)->dest + local_c0 == 0) ||
                 (parln.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_start[1].dest + local_c0 == 0)) {
                sVar4 = -local_c0;
                if (0 < (long)local_c0) {
                  sVar4 = local_c0;
                }
                uVar1 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar4].sequence._M_string_length;
                if (uVar1 <= max_size && min_size <= uVar1) {
                  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,local_d0);
                  *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
                  sVar4 = -local_c0;
                  if (0 < (long)local_c0) {
                    sVar4 = local_c0;
                  }
                  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,sVar4);
                  *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
                  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                  emplace_back<long&,long&>(local_c8,(long *)&local_d0,(long *)&local_c0);
                }
              }
            }
            std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                      (&parlp.super__Vector_base<Link,_std::allocator<Link>_>);
          }
          std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                    (&parln.super__Vector_base<Link,_std::allocator<Link>_>);
        }
        std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                  (&bwl.super__Vector_base<Link,_std::allocator<Link>_>);
      }
      std::_Vector_base<Link,_std::allocator<Link>_>::~_Vector_base
                (&fwl.super__Vector_base<Link,_std::allocator<Link>_>);
    }
    local_d0 = local_d0 + 1;
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&used.super__Bvector_base<std::allocator<bool>_>);
  return (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_c8;
}

Assistant:

std::vector<std::pair<sgNodeID_t,sgNodeID_t>> DistanceGraph::find_bubbles(uint32_t min_size,uint32_t max_size) const {
    std::vector<std::pair<sgNodeID_t,sgNodeID_t>> r;
    std::vector<bool> used(sdg.nodes.size(),false);
    sgNodeID_t n1,n2;
    size_t s1,s2;
    for (n1=1;n1<sdg.nodes.size();++n1){
        if (used[n1]) continue;
        //get "topologically correct" bubble: prev -> [n1 | n2] -> next
        s1=sdg.nodes[n1].sequence.size();
        if (s1<min_size or s1>max_size) continue;

        auto fwl=get_fw_links(n1);
        if (fwl.size()!=1) continue;
        auto bwl=get_bw_links(n1);
        if (bwl.size()!=1) continue;
        auto next=fwl[0].dest;
        auto prev=bwl[0].dest;
        auto parln=get_bw_links(next);
        if (parln.size()!=2) continue;
        auto parlp=get_fw_links(-prev);
        if (parlp.size()!=2) continue;

        if (parlp[0].dest!=n1) n2=parlp[0].dest;
        else n2=parlp[1].dest;

        if (n2!=-parln[0].dest and n2!=-parln[1].dest) continue;
        s2=sdg.nodes[llabs(n2)].sequence.size();
        if (s2<min_size or s2>max_size) continue;

        used[n1]=true;
        used[llabs(n2)]=true;
        r.emplace_back(n1,n2);

    }
    return r;
}